

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortHelper.cpp
# Opt level: O0

void Kernel::SortHelper::collectVariableSortsIter
               (CollectTask task,
               DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *map,
               bool ignoreBound)

{
  CollectTask elem;
  CollectTask elem_00;
  CollectTask elem_01;
  CollectTask elem_02;
  CollectTask elem_03;
  CollectTask elem_04;
  CollectTask elem_05;
  CollectTask elem_06;
  CollectTask elem_07;
  CollectTask elem_08;
  CollectTask elem_09;
  CollectTask elem_10;
  CollectTask elem_11;
  CollectTask elem_12;
  CollectTask elem_13;
  CollectTask elem_14;
  CollectTask elem_15;
  CollectTask elem_16;
  CollectTask elem_17;
  CollectTask elem_18;
  CollectTask elem_19;
  CollectTask elem_20;
  CollectTask elem_21;
  CollectTask elem_22;
  CollectTask elem_23;
  CollectTask elem_24;
  TermList val;
  TermList val_00;
  TermList val_01;
  TermList val_02;
  bool bVar1;
  int iVar2;
  SpecialFunctor SVar3;
  uint uVar4;
  uint uVar5;
  Connective CVar6;
  TermList TVar7;
  VList *pVVar8;
  SpecialTermData *this;
  TermList *pTVar9;
  FormulaList *l;
  Formula *pFVar10;
  byte in_SIL;
  Formula *in_stack_00000008;
  TermList in_stack_00000010;
  OperatorType *in_stack_00000018;
  Iterator vit_3;
  Iterator vit_2;
  CollectTask newTask_14;
  CollectTask rightTask;
  CollectTask leftTask;
  CollectTask newTask_13;
  Iterator argIt;
  CollectTask bindTask;
  CollectTask newTask_12;
  CollectTask unbindTask;
  CollectTask newTask_11;
  TermList ts_2;
  CollectTask newTask_9;
  CollectTask newTask_10;
  Literal *lit;
  Formula *f;
  uint i_2;
  TermList matchedSort;
  CollectTask newTask_8;
  CollectTask newTask_7;
  CollectTask newTask_6;
  CollectTask newTask_5;
  CollectTask newTask_4;
  TermList sort_1;
  uint var_2;
  uint i_1;
  OperatorType *type_1;
  Iterator vit_1;
  Substitution subst_1;
  Symbol *symbol_1;
  TermList binding_1;
  CollectTask newTask_3;
  TermList sort;
  uint var_1;
  uint i;
  OperatorType *type;
  Substitution subst;
  Iterator vit;
  Symbol *symbol;
  bool isPredicate;
  TermList binding;
  CollectTask newTask_2;
  SpecialTermData *sd;
  Term *term_2;
  uint var;
  CollectTask newTask_1;
  Term *term_1;
  TermList ts_1;
  CollectTask newTask;
  TermList *ts;
  uint position;
  Term *term;
  CollectTask task_1;
  MultiCounter bound;
  Stack<Kernel::SortHelper::CollectTask> todo;
  CollectWhat CVar12;
  undefined1 uVar13;
  undefined8 uVar11;
  Stack<Kernel::SortHelper::CollectTask> *pSVar14;
  size_t in_stack_fffffffffffff5b8;
  OperatorType *this_00;
  undefined4 in_stack_fffffffffffff5c0;
  uint in_stack_fffffffffffff5c4;
  uint in_stack_fffffffffffff5c8;
  undefined4 in_stack_fffffffffffff5cc;
  uint in_stack_fffffffffffff5d0;
  undefined4 in_stack_fffffffffffff5d4;
  undefined7 in_stack_fffffffffffff5f8;
  undefined1 in_stack_fffffffffffff5ff;
  Signature *in_stack_fffffffffffff610;
  Signature *in_stack_fffffffffffff618;
  OperatorType *local_800;
  Symbol *local_7d0;
  bool local_7a2;
  Iterator local_708;
  Iterator local_700;
  Formula *local_6f8;
  Signature *pSStack_6f0;
  OperatorType *local_6e8;
  Formula *local_6e0;
  Signature *pSStack_6d8;
  OperatorType *local_6d0;
  Formula *local_6c8;
  Signature *pSStack_6c0;
  OperatorType *local_6b8;
  Formula *local_6b0;
  Signature *pSStack_6a8;
  OperatorType *local_6a0;
  undefined8 local_698;
  Formula *pFStack_690;
  undefined8 local_688;
  undefined8 local_680;
  Formula *pFStack_678;
  undefined8 local_670;
  Formula *local_668;
  Signature *pSStack_660;
  OperatorType *local_658;
  Formula *local_648;
  Signature *pSStack_640;
  OperatorType *local_638;
  Iterator local_630;
  Formula *local_628;
  Signature *pSStack_620;
  OperatorType *local_618;
  Formula *local_610;
  Signature *pSStack_608;
  OperatorType *local_600;
  Formula *local_5f8;
  Signature *pSStack_5f0;
  OperatorType *local_5e8;
  Formula *local_5e0;
  Signature *pSStack_5d8;
  OperatorType *local_5d0;
  Formula *local_5c8;
  Signature *pSStack_5c0;
  undefined8 local_5b8;
  Formula *local_5b0;
  Signature *pSStack_5a8;
  undefined8 local_5a0;
  Formula *local_598;
  Signature *pSStack_590;
  uint64_t local_588;
  uint64_t local_578;
  Formula *local_570;
  Signature *pSStack_568;
  uint64_t local_560;
  uint64_t local_558;
  TermList local_550;
  Formula *local_548;
  Signature *pSStack_540;
  OperatorType *local_538;
  Formula *local_530;
  Signature *pSStack_528;
  OperatorType *local_520;
  undefined8 local_518;
  Signature *pSStack_510;
  uint64_t local_508;
  uint64_t local_500;
  uint64_t local_4f8;
  undefined8 local_4f0;
  Signature *pSStack_4e8;
  uint64_t local_4e0;
  Signature *local_4d8;
  anon_union_8_4_8765d89c_for_CollectTask_1 local_4d0;
  Formula *local_4c8;
  Signature *pSStack_4c0;
  uint64_t local_4b8;
  uint64_t local_4b0;
  Formula *local_4a8;
  Stack<Kernel::SortHelper::CollectTask> *pSStack_4a0;
  OperatorType *local_498;
  uint local_48c;
  Formula *local_488;
  Signature *pSStack_480;
  OperatorType *local_478;
  OperatorType *local_468;
  Formula *local_460;
  Signature *pSStack_458;
  OperatorType *local_450;
  Formula *local_448;
  Signature *pSStack_440;
  OperatorType *local_438;
  Formula *local_430;
  Signature *pSStack_428;
  OperatorType *local_420;
  Formula *local_418;
  uint64_t uStack_410;
  OperatorType *local_408;
  uint64_t local_400;
  uint64_t local_3f8;
  Formula *local_3f0;
  uint64_t uStack_3e8;
  OperatorType *local_3e0;
  Formula *local_3d8;
  Signature *pSStack_3d0;
  OperatorType *local_3c8;
  Formula *local_3c0;
  Signature *pSStack_3b8;
  OperatorType *local_3b0;
  Formula *local_3a8;
  Signature *pSStack_3a0;
  uint64_t local_398;
  uint64_t local_388;
  uint64_t local_380;
  Formula *local_378;
  Stack<Kernel::SortHelper::CollectTask> *pSStack_370;
  OperatorType *local_368;
  uint64_t local_358;
  Formula *local_350;
  Signature *pSStack_348;
  OperatorType *local_340;
  uint64_t local_338;
  uint64_t local_330;
  uint64_t local_328;
  sockaddr *local_320;
  TermList local_318;
  uint64_t local_310;
  uint local_308;
  uint local_304;
  OperatorType *local_300;
  Iterator local_2f8;
  Substitution local_2f0;
  Symbol *local_2c8;
  Signature *local_2c0;
  Formula *local_2b8;
  Signature *pSStack_2b0;
  OperatorType *local_2a8;
  uint64_t local_298;
  uint64_t local_290;
  Formula *local_288;
  Stack<Kernel::SortHelper::CollectTask> *pSStack_280;
  OperatorType *local_278;
  uint64_t local_270;
  Formula *local_268;
  Signature *pSStack_260;
  OperatorType *local_258;
  uint64_t local_250;
  uint64_t local_248;
  uint64_t local_240;
  sockaddr *local_238;
  TermList local_230;
  uint64_t local_228;
  uint local_220;
  uint local_21c;
  OperatorType *local_218;
  Substitution local_210;
  Iterator local_1e8;
  Symbol *local_1e0;
  bool local_1d1;
  Signature *local_1d0;
  Formula *local_1c8;
  Signature *pSStack_1c0;
  OperatorType *local_1b8;
  undefined8 local_1a8;
  Stack<Kernel::SortHelper::CollectTask> *pSStack_1a0;
  OperatorType *local_198;
  undefined8 local_188;
  Stack<Kernel::SortHelper::CollectTask> *pSStack_180;
  OperatorType *local_178;
  uint64_t local_168;
  undefined4 local_160;
  undefined4 uStack_15c;
  Signature *pSStack_158;
  OperatorType *local_150;
  SpecialTermData *local_148;
  anon_union_8_4_8765d89c_for_CollectTask_1 local_140;
  OperatorType *local_138;
  uint local_12c;
  Formula *local_128;
  Signature *pSStack_120;
  OperatorType *local_118;
  Formula *local_110;
  Signature *pSStack_108;
  OperatorType *local_100;
  Signature *local_f8;
  anon_union_8_4_8765d89c_for_CollectTask_1 local_f0;
  Formula *local_e8;
  Signature *pSStack_e0;
  uint64_t local_d8;
  uint64_t local_c8;
  Formula *local_c0;
  Signature *pSStack_b8;
  uint64_t local_b0;
  TermList *local_a8;
  int local_9c;
  anon_union_8_4_8765d89c_for_CollectTask_1 local_98;
  CollectTask local_90 [4];
  Stack<Kernel::SortHelper::CollectTask> local_30;
  byte local_9;
  
  local_9 = in_SIL & 1;
  Lib::Stack<Kernel::SortHelper::CollectTask>::Stack
            ((Stack<Kernel::SortHelper::CollectTask> *)
             CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0),in_stack_fffffffffffff5b8
            );
  Lib::MultiCounter::MultiCounter((MultiCounter *)0x97c5d9);
  elem._4_4_ = in_stack_fffffffffffff5c4;
  elem.fncTag = in_stack_fffffffffffff5c0;
  elem.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
  elem.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
  elem.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
  elem.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
  Lib::Stack<Kernel::SortHelper::CollectTask>::push
            ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem);
  TVar7._content = (uint64_t)in_stack_00000018;
  do {
    bVar1 = Lib::Stack<Kernel::SortHelper::CollectTask>::isNonEmpty(&local_30);
    if (!bVar1) {
      Lib::MultiCounter::~MultiCounter((MultiCounter *)0x97e410);
      Lib::Stack<Kernel::SortHelper::CollectTask>::~Stack
                ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content);
      return;
    }
    Lib::Stack<Kernel::SortHelper::CollectTask>::pop(local_90,&local_30);
    switch(local_90[0].fncTag) {
    case COLLECT_TERM:
      local_98.t = local_90[0].field_1.t;
      local_9c = 0;
      local_a8 = Term::args(local_90[0].field_1.t);
      while (bVar1 = TermList::isNonEmpty((TermList *)0x97c714), bVar1) {
        CollectTask::CollectTask
                  ((CollectTask *)in_stack_00000010._content,
                   (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
        pSStack_b8 = (Signature *)local_a8->_content;
        local_9c = local_9c + 1;
        TVar7 = getArgSort((Term *)in_stack_fffffffffffff618,
                           (uint)((ulong)in_stack_fffffffffffff610 >> 0x20));
        local_e8 = local_c0;
        pSStack_e0 = pSStack_b8;
        elem_00._4_4_ = in_stack_fffffffffffff5c4;
        elem_00.fncTag = in_stack_fffffffffffff5c0;
        elem_00.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_00.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_00.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_00.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_c0;
        in_stack_00000010._content = (uint64_t)pSStack_b8;
        local_d8 = TVar7._content;
        local_c8 = TVar7._content;
        local_b0 = TVar7._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)pSStack_b8,elem_00);
        local_a8 = TermList::next(local_a8);
      }
      break;
    case COLLECT_TERMLIST:
      local_f0.t = local_90[0].field_1.t;
      bVar1 = TermList::isTerm((TermList *)0x97c836);
      if (bVar1) {
        local_f8 = (Signature *)TermList::term((TermList *)0x97c85c);
        CVar12 = (CollectWhat)((ulong)in_stack_00000008 >> 0x20);
        Term::isSpecial((Term *)0x97c883);
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        pSStack_108 = local_f8;
        local_100 = (OperatorType *)local_90[0].contextSort._content;
        local_118 = (OperatorType *)local_90[0].contextSort._content;
        local_128 = local_110;
        pSStack_120 = local_f8;
        elem_01._4_4_ = in_stack_fffffffffffff5c4;
        elem_01.fncTag = in_stack_fffffffffffff5c0;
        elem_01.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_01.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_01.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_01.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_110;
        in_stack_00000010._content = (uint64_t)local_f8;
        TVar7._content = local_90[0].contextSort._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)local_f8,elem_01);
      }
      else {
        bVar1 = TermList::isOrdinaryVar((TermList *)0x97c925);
        if ((bVar1) &&
           ((local_12c = TermList::var(&local_f0.ts), (local_9 & 1) == 0 ||
            (iVar2 = Lib::MultiCounter::get
                               ((MultiCounter *)in_stack_00000010._content,
                                (int)((ulong)in_stack_00000008 >> 0x20)), iVar2 == 0)))) {
          local_138 = (OperatorType *)local_90[0].contextSort._content;
          val._content._4_4_ = in_stack_fffffffffffff5d4;
          val._content._0_4_ = in_stack_fffffffffffff5d0;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                     CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     in_stack_fffffffffffff5c4,val);
        }
      }
      break;
    case COLLECT_SPECIALTERM:
      local_140.t = local_90[0].field_1.t;
      local_148 = Term::getSpecialData(local_90[0].field_1.t);
      SVar3 = Term::specialFunctor((Term *)0x97ca28);
      CVar12 = (CollectWhat)((ulong)in_stack_00000008 >> 0x20);
      switch(SVar3) {
      case ITE:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        local_168 = (uint64_t)Term::SpecialTermData::getSort(TVar7._content);
        local_150 = (OperatorType *)local_168;
        pTVar9 = Term::nthArgument(local_140.t,0);
        pSStack_180 = (Stack<Kernel::SortHelper::CollectTask> *)pTVar9->_content;
        local_178 = local_150;
        local_188 = CONCAT44(uStack_15c,local_160);
        elem_02._4_4_ = in_stack_fffffffffffff5c4;
        elem_02.fncTag = in_stack_fffffffffffff5c0;
        elem_02.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_02.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_02.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_02.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        pSStack_158 = (Signature *)pSStack_180;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(pSStack_180,elem_02);
        pTVar9 = Term::nthArgument(local_140.t,1);
        pSStack_1a0 = (Stack<Kernel::SortHelper::CollectTask> *)pTVar9->_content;
        local_198 = local_150;
        local_1a8 = CONCAT44(uStack_15c,local_160);
        elem_03._4_4_ = in_stack_fffffffffffff5c4;
        elem_03.fncTag = in_stack_fffffffffffff5c0;
        elem_03.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_03.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_03.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_03.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        pSStack_158 = (Signature *)pSStack_1a0;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(pSStack_1a0,elem_03);
        local_160 = 3;
        in_stack_00000010._content = (uint64_t)Term::SpecialTermData::getCondition(local_148);
        local_1b8 = local_150;
        in_stack_00000008 = (Formula *)CONCAT44(uStack_15c,local_160);
        elem_04._4_4_ = in_stack_fffffffffffff5c4;
        elem_04.fncTag = in_stack_fffffffffffff5c0;
        elem_04.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_04.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_04.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_04.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        TVar7._content = (uint64_t)local_150;
        local_1c8 = in_stack_00000008;
        pSStack_1c0 = (Signature *)in_stack_00000010._content;
        pSStack_158 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_04);
        break;
      case LET:
        local_1d0 = (Signature *)
                    Term::SpecialTermData::getBinding((SpecialTermData *)TVar7._content);
        bVar1 = TermList::isTerm((TermList *)0x97cc4f);
        local_7a2 = false;
        if (bVar1) {
          TermList::term((TermList *)0x97cc7c);
          local_7a2 = Term::isBoolean((Term *)CONCAT17(in_stack_fffffffffffff5ff,
                                                       in_stack_fffffffffffff5f8));
        }
        local_1d1 = local_7a2;
        if (local_7a2 == false) {
          Term::SpecialTermData::getFunctor((SpecialTermData *)in_stack_00000010._content);
          local_7d0 = Signature::getFunction
                                ((Signature *)in_stack_00000010._content,
                                 (uint)((ulong)in_stack_00000008 >> 0x20));
        }
        else {
          Term::SpecialTermData::getFunctor((SpecialTermData *)in_stack_00000010._content);
          local_7d0 = Signature::getPredicate
                                ((Signature *)in_stack_00000010._content,
                                 (uint)((ulong)in_stack_00000008 >> 0x20));
        }
        local_1e0 = local_7d0;
        pVVar8 = Term::SpecialTermData::getVariables(local_148);
        Lib::List<unsigned_int>::Iterator::Iterator(&local_1e8,pVVar8);
        Kernel::Substitution::Substitution((Substitution *)0x97cdc3);
        if ((local_1d1 & 1U) == 0) {
          local_800 = Signature::Symbol::fnType
                                ((Symbol *)
                                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
        }
        else {
          local_800 = Signature::Symbol::predType
                                ((Symbol *)
                                 CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
        }
        local_218 = local_800;
        for (local_21c = 0; uVar4 = local_21c,
            uVar5 = OperatorType::arity((OperatorType *)in_stack_00000010._content), uVar4 < uVar5;
            local_21c = local_21c + 1) {
          local_220 = Lib::List<unsigned_int>::Iterator::next
                                ((Iterator *)in_stack_00000010._content);
          local_228 = (uint64_t)AtomicSort::superSort();
          uVar4 = local_21c;
          uVar5 = OperatorType::numTypeArguments(local_218);
          if (uVar4 < uVar5) {
            local_230 = OperatorType::quantifiedVar((OperatorType *)in_stack_00000008,0);
            uVar4 = TermList::var(&local_230);
            TermList::TermList((TermList *)in_stack_00000010._content,
                               (uint)((ulong)in_stack_00000008 >> 0x20),
                               SUB81((ulong)in_stack_00000008 >> 0x18,0));
            Kernel::Substitution::bind(&local_210,uVar4,local_238,uVar5);
          }
          else {
            local_248 = (uint64_t)
                        OperatorType::arg(TVar7._content,(uint)(in_stack_00000010._content >> 0x20))
            ;
            local_240 = (uint64_t)
                        SubstHelper::apply<Kernel::Substitution>
                                  (TVar7,in_stack_00000010._content,
                                   SUB81((ulong)in_stack_00000008 >> 0x38,0));
            local_228 = local_240;
          }
          if (((local_9 & 1) == 0) ||
             (iVar2 = Lib::MultiCounter::get
                                ((MultiCounter *)in_stack_00000010._content,
                                 (int)((ulong)in_stack_00000008 >> 0x20)), iVar2 == 0)) {
            local_250 = local_228;
            val_00._content._4_4_ = in_stack_fffffffffffff5d4;
            val_00._content._0_4_ = in_stack_fffffffffffff5d0;
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       in_stack_fffffffffffff5c4,val_00);
          }
        }
        CollectTask::CollectTask
                  ((CollectTask *)in_stack_00000010._content,
                   (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
        local_270 = (uint64_t)Term::SpecialTermData::getSort(TVar7._content);
        local_258 = (OperatorType *)local_270;
        pTVar9 = Term::nthArgument(local_140.t,0);
        pSVar14 = (Stack<Kernel::SortHelper::CollectTask> *)pTVar9->_content;
        local_278 = local_258;
        local_288 = local_268;
        elem_05._4_4_ = in_stack_fffffffffffff5c4;
        elem_05.fncTag = in_stack_fffffffffffff5c0;
        elem_05.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_05.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_05.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_05.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        pFVar10 = local_268;
        TVar7._content = (uint64_t)local_258;
        pSStack_280 = pSVar14;
        pSStack_260 = (Signature *)pSVar14;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(pSVar14,elem_05);
        uVar13 = (undefined1)((ulong)pFVar10 >> 0x38);
        pSStack_260 = local_1d0;
        if ((local_1d1 & 1U) == 0) {
          local_298 = (uint64_t)OperatorType::result(TVar7._content);
          local_290 = (uint64_t)
                      SubstHelper::apply<Kernel::Substitution>
                                (TVar7,(Substitution *)pSVar14,(bool)uVar13);
          local_258 = (OperatorType *)local_290;
        }
        local_2a8 = local_258;
        local_2b8 = local_268;
        pSStack_2b0 = pSStack_260;
        elem_06._4_4_ = in_stack_fffffffffffff5c4;
        elem_06.fncTag = in_stack_fffffffffffff5c0;
        elem_06.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_06.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_06.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_06.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_268;
        in_stack_00000010._content = (uint64_t)pSStack_260;
        TVar7._content = (uint64_t)local_258;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)pSStack_260,elem_06);
        Kernel::Substitution::~Substitution((Substitution *)0x97d230);
        break;
      case FORMULA:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        in_stack_00000010._content = (uint64_t)Term::SpecialTermData::getFormula(local_148);
        local_3c8 = local_3b0;
        local_3d8 = local_3c0;
        elem_09._4_4_ = in_stack_fffffffffffff5c4;
        elem_09.fncTag = in_stack_fffffffffffff5c0;
        elem_09.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_09.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_09.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_09.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_3c0;
        TVar7._content = (uint64_t)local_3b0;
        pSStack_3d0 = (Signature *)in_stack_00000010._content;
        pSStack_3b8 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_09);
        break;
      case TUPLE:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        in_stack_00000010._content = (uint64_t)Term::SpecialTermData::getTupleTerm(local_148);
        local_438 = local_420;
        local_448 = local_430;
        elem_11._4_4_ = in_stack_fffffffffffff5c4;
        elem_11.fncTag = in_stack_fffffffffffff5c0;
        elem_11.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_11.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_11.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_11.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_430;
        TVar7._content = (uint64_t)local_420;
        pSStack_440 = (Signature *)in_stack_00000010._content;
        pSStack_428 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_11);
        break;
      case LET_TUPLE:
        local_2c0 = (Signature *)
                    Term::SpecialTermData::getBinding((SpecialTermData *)TVar7._content);
        Term::SpecialTermData::getFunctor((SpecialTermData *)in_stack_00000010._content);
        local_2c8 = Signature::getFunction
                              ((Signature *)in_stack_00000010._content,
                               (uint)((ulong)in_stack_00000008 >> 0x20));
        Kernel::Substitution::Substitution((Substitution *)0x97d2c0);
        pVVar8 = Term::SpecialTermData::getTupleSymbols(local_148);
        Lib::List<unsigned_int>::Iterator::Iterator(&local_2f8,pVVar8);
        local_300 = Signature::Symbol::fnType
                              ((Symbol *)
                               CONCAT44(in_stack_fffffffffffff5c4,in_stack_fffffffffffff5c0));
        for (local_304 = 0; uVar4 = local_304,
            uVar5 = OperatorType::arity((OperatorType *)in_stack_00000010._content), uVar4 < uVar5;
            local_304 = local_304 + 1) {
          local_308 = Lib::List<unsigned_int>::Iterator::next
                                ((Iterator *)in_stack_00000010._content);
          local_310 = (uint64_t)AtomicSort::superSort();
          uVar4 = local_304;
          uVar5 = OperatorType::numTypeArguments(local_300);
          if (uVar4 < uVar5) {
            local_318 = OperatorType::quantifiedVar((OperatorType *)in_stack_00000008,0);
            uVar4 = TermList::var(&local_318);
            TermList::TermList((TermList *)in_stack_00000010._content,
                               (uint)((ulong)in_stack_00000008 >> 0x20),
                               SUB81((ulong)in_stack_00000008 >> 0x18,0));
            Kernel::Substitution::bind(&local_2f0,uVar4,local_320,uVar5);
          }
          else {
            local_330 = (uint64_t)
                        OperatorType::arg(TVar7._content,(uint)(in_stack_00000010._content >> 0x20))
            ;
            local_328 = (uint64_t)
                        SubstHelper::apply<Kernel::Substitution>
                                  (TVar7,in_stack_00000010._content,
                                   SUB81((ulong)in_stack_00000008 >> 0x38,0));
            local_310 = local_328;
          }
          if (((local_9 & 1) == 0) ||
             (iVar2 = Lib::MultiCounter::get
                                ((MultiCounter *)in_stack_00000010._content,
                                 (int)((ulong)in_stack_00000008 >> 0x20)), iVar2 == 0)) {
            local_338 = local_310;
            val_01._content._4_4_ = in_stack_fffffffffffff5d4;
            val_01._content._0_4_ = in_stack_fffffffffffff5d0;
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *
                       )CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       in_stack_fffffffffffff5c4,val_01);
          }
        }
        CollectTask::CollectTask
                  ((CollectTask *)in_stack_00000010._content,
                   (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
        local_358 = (uint64_t)Term::SpecialTermData::getSort(TVar7._content);
        local_340 = (OperatorType *)local_358;
        pTVar9 = Term::nthArgument(local_140.t,0);
        pSVar14 = (Stack<Kernel::SortHelper::CollectTask> *)pTVar9->_content;
        local_368 = local_340;
        local_378 = local_350;
        elem_07._4_4_ = in_stack_fffffffffffff5c4;
        elem_07.fncTag = in_stack_fffffffffffff5c0;
        elem_07.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_07.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_07.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_07.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        pFVar10 = local_350;
        TVar7._content = (uint64_t)local_340;
        pSStack_370 = pSVar14;
        pSStack_348 = (Signature *)pSVar14;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push(pSVar14,elem_07);
        uVar13 = (undefined1)((ulong)pFVar10 >> 0x38);
        local_388 = (uint64_t)OperatorType::result(TVar7._content);
        TVar7 = SubstHelper::apply<Kernel::Substitution>(TVar7,(Substitution *)pSVar14,(bool)uVar13)
        ;
        pSStack_348 = local_2c0;
        local_3a8 = local_350;
        pSStack_3a0 = local_2c0;
        elem_08._4_4_ = in_stack_fffffffffffff5c4;
        elem_08.fncTag = in_stack_fffffffffffff5c0;
        elem_08.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_08.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_08.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_08.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_350;
        in_stack_00000010._content = (uint64_t)local_2c0;
        local_398 = TVar7._content;
        local_380 = TVar7._content;
        local_340 = (OperatorType *)TVar7;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)local_2c0,elem_08);
        Kernel::Substitution::~Substitution((Substitution *)0x97d70c);
        break;
      case LAMBDA:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        local_3f8 = (uint64_t)Term::SpecialTermData::getLambdaExpSort(local_148);
        local_3e0 = (OperatorType *)local_3f8;
        in_stack_00000010 = Term::SpecialTermData::getLambdaExp(local_148);
        local_408 = local_3e0;
        local_418 = local_3f0;
        elem_10._4_4_ = in_stack_fffffffffffff5c4;
        elem_10.fncTag = in_stack_fffffffffffff5c0;
        elem_10.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_10.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_10.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_10.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_3f0;
        TVar7._content = (uint64_t)local_3e0;
        uStack_410 = in_stack_00000010._content;
        local_400 = in_stack_00000010._content;
        uStack_3e8 = in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_10);
        break;
      case MATCH:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        this = Term::getSpecialData(local_140.t);
        local_468 = (OperatorType *)Term::SpecialTermData::getMatchedSort(this);
        pTVar9 = Term::nthArgument(local_140.t,0);
        in_stack_00000010._content = pTVar9->_content;
        local_450 = local_468;
        local_478 = local_468;
        local_488 = local_460;
        elem_12._4_4_ = in_stack_fffffffffffff5c4;
        elem_12.fncTag = in_stack_fffffffffffff5c0;
        elem_12.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_12.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_12.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_12.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_460;
        TVar7._content = (uint64_t)local_468;
        pSStack_480 = (Signature *)in_stack_00000010._content;
        pSStack_458 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_12);
        for (local_48c = 1; uVar4 = local_48c, uVar5 = Term::arity(local_140.t), uVar4 < uVar5;
            local_48c = local_48c + 2) {
          pTVar9 = Term::nthArgument(local_140.t,local_48c);
          pSStack_4a0 = (Stack<Kernel::SortHelper::CollectTask> *)pTVar9->_content;
          local_450 = local_468;
          local_498 = local_468;
          local_4a8 = local_460;
          elem_13._4_4_ = in_stack_fffffffffffff5c4;
          elem_13.fncTag = in_stack_fffffffffffff5c0;
          elem_13.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_13.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_13.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_13.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          this_00 = local_468;
          pSStack_458 = (Signature *)pSStack_4a0;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push(pSStack_4a0,elem_13);
          pTVar9 = Term::nthArgument(local_140.t,local_48c + 1);
          pSStack_458 = (Signature *)pTVar9->_content;
          TVar7 = Term::SpecialTermData::getSort((SpecialTermData *)this_00);
          local_4c8 = local_460;
          pSStack_4c0 = pSStack_458;
          elem_14._4_4_ = in_stack_fffffffffffff5c4;
          elem_14.fncTag = in_stack_fffffffffffff5c0;
          elem_14.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_14.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_14.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_14.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          in_stack_00000008 = local_460;
          in_stack_00000010._content = (uint64_t)pSStack_458;
          local_4b8 = TVar7._content;
          local_4b0 = TVar7._content;
          local_450 = (OperatorType *)TVar7;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)pSStack_458,elem_14);
        }
      }
      break;
    case COLLECT_FORMULA:
      local_4d0.t = local_90[0].field_1.t;
      CVar6 = Formula::connective(local_90[0].field_1.f);
      CVar12 = (CollectWhat)((ulong)in_stack_00000008 >> 0x20);
      switch(CVar6) {
      case LITERAL:
        local_4d8 = (Signature *)Formula::literal((Formula *)0x97dbcd);
        CVar12 = (CollectWhat)((ulong)in_stack_00000008 >> 0x20);
        bVar1 = Term::isTwoVarEquality((Term *)local_4d8);
        if (bVar1) {
          CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
          local_4f8 = (uint64_t)Literal::twoVarEqSort((Literal *)local_4d8);
          pSStack_4e8 = (Signature *)local_4f8;
          local_508 = (uint64_t)AtomicSort::superSort();
          local_518 = local_4f0;
          pSStack_510 = pSStack_4e8;
          elem_15._4_4_ = in_stack_fffffffffffff5c4;
          elem_15.fncTag = in_stack_fffffffffffff5c0;
          elem_15.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_15.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_15.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_15.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          uVar11 = local_4f0;
          in_stack_00000010._content = (uint64_t)pSStack_4e8;
          local_500 = local_508;
          local_4e0 = local_508;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)pSStack_4e8,elem_15);
          CVar12 = (CollectWhat)((ulong)uVar11 >> 0x20);
        }
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        pSStack_528 = local_4d8;
        local_538 = local_520;
        local_548 = local_530;
        pSStack_540 = local_4d8;
        elem_16._4_4_ = in_stack_fffffffffffff5c4;
        elem_16.fncTag = in_stack_fffffffffffff5c0;
        elem_16.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_16.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_16.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_16.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_530;
        in_stack_00000010._content = (uint64_t)local_4d8;
        TVar7._content = (uint64_t)local_520;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)local_4d8,elem_16);
        break;
      case AND:
      case OR:
        l = Formula::args((Formula *)0x97e0ee);
        Lib::List<Kernel::Formula_*>::Iterator::Iterator(&local_630,l);
        while (in_stack_fffffffffffff5ff =
                    Lib::List<Kernel::Formula_*>::Iterator::hasNext((Iterator *)0x97e118),
              (bool)in_stack_fffffffffffff5ff) {
          CollectTask::CollectTask
                    ((CollectTask *)in_stack_00000010._content,
                     (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
          in_stack_00000010._content =
               (uint64_t)Lib::List<Kernel::Formula_*>::Iterator::next(in_stack_00000010._content);
          local_658 = local_638;
          local_668 = local_648;
          elem_21._4_4_ = in_stack_fffffffffffff5c4;
          elem_21.fncTag = in_stack_fffffffffffff5c0;
          elem_21.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_21.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_21.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_21.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          in_stack_00000008 = local_648;
          TVar7._content = (uint64_t)local_638;
          pSStack_660 = (Signature *)in_stack_00000010._content;
          pSStack_640 = (Signature *)in_stack_00000010._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_21);
        }
        break;
      case IMP:
      case IFF:
      case XOR:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        pFVar10 = Formula::left((Formula *)0x97e1d4);
        local_688 = local_670;
        local_698 = local_680;
        elem_22._4_4_ = in_stack_fffffffffffff5c4;
        elem_22.fncTag = in_stack_fffffffffffff5c0;
        elem_22.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_22.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_22.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_22.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        uVar11 = local_680;
        pFStack_690 = pFVar10;
        pFStack_678 = pFVar10;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)pFVar10,elem_22);
        CollectTask::CollectTask((CollectTask *)pFVar10,(CollectWhat)((ulong)uVar11 >> 0x20));
        in_stack_00000010._content = (uint64_t)Formula::right((Formula *)0x97e252);
        local_6b8 = local_6a0;
        local_6c8 = local_6b0;
        elem_23._4_4_ = in_stack_fffffffffffff5c4;
        elem_23.fncTag = in_stack_fffffffffffff5c0;
        elem_23.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_23.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_23.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_23.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_6b0;
        TVar7._content = (uint64_t)local_6a0;
        pSStack_6c0 = (Signature *)in_stack_00000010._content;
        pSStack_6a8 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_23);
        break;
      case NOT:
        CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
        in_stack_00000010._content = (uint64_t)Formula::uarg((Formula *)0x97e2d5);
        local_6e8 = local_6d0;
        local_6f8 = local_6e0;
        elem_24._4_4_ = in_stack_fffffffffffff5c4;
        elem_24.fncTag = in_stack_fffffffffffff5c0;
        elem_24.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_24.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_24.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_24.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_6e0;
        TVar7._content = (uint64_t)local_6d0;
        pSStack_6f0 = (Signature *)in_stack_00000010._content;
        pSStack_6d8 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_24);
        break;
      case FORALL:
      case EXISTS:
        if ((local_9 & 1) != 0) {
          CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
          in_stack_00000010._content = (uint64_t)Formula::vars((Formula *)0x97df71);
          local_5b8 = local_5a0;
          local_5c8 = local_5b0;
          elem_18._4_4_ = in_stack_fffffffffffff5c4;
          elem_18.fncTag = in_stack_fffffffffffff5c0;
          elem_18.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_18.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_18.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_18.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          in_stack_00000008 = local_5b0;
          in_stack_fffffffffffff618 = (Signature *)in_stack_00000010._content;
          pSStack_5c0 = (Signature *)in_stack_00000010._content;
          pSStack_5a8 = (Signature *)in_stack_00000010._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_18);
        }
        CollectTask::CollectTask
                  ((CollectTask *)in_stack_00000010._content,
                   (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
        in_stack_00000010._content = (uint64_t)Formula::qarg((Formula *)0x97dff1);
        local_5e8 = local_5d0;
        local_5f8 = local_5e0;
        elem_19._4_4_ = in_stack_fffffffffffff5c4;
        elem_19.fncTag = in_stack_fffffffffffff5c0;
        elem_19.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
        elem_19.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
        elem_19.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
        elem_19.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
        in_stack_00000008 = local_5e0;
        TVar7._content = (uint64_t)local_5d0;
        in_stack_fffffffffffff610 = (Signature *)in_stack_00000010._content;
        pSStack_5f0 = (Signature *)in_stack_00000010._content;
        pSStack_5d8 = (Signature *)in_stack_00000010._content;
        Lib::Stack<Kernel::SortHelper::CollectTask>::push
                  ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_19);
        if ((local_9 & 1) != 0) {
          CollectTask::CollectTask
                    ((CollectTask *)in_stack_00000010._content,
                     (CollectWhat)((ulong)in_stack_00000008 >> 0x20));
          in_stack_00000010._content = (uint64_t)Formula::vars((Formula *)0x97e07d);
          local_618 = local_600;
          local_628 = local_610;
          elem_20._4_4_ = in_stack_fffffffffffff5c4;
          elem_20.fncTag = in_stack_fffffffffffff5c0;
          elem_20.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_20.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_20.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_20.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          in_stack_00000008 = local_610;
          TVar7._content = (uint64_t)local_600;
          pSStack_620 = (Signature *)in_stack_00000010._content;
          pSStack_608 = (Signature *)in_stack_00000010._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)in_stack_00000010._content,elem_20);
        }
        break;
      case BOOL_TERM:
        local_550 = Formula::getBooleanTerm(in_stack_00000008);
        bVar1 = TermList::isVar((TermList *)in_stack_00000010._content);
        if (!bVar1) {
          TermList::term((TermList *)0x97de64);
          CVar12 = (CollectWhat)((ulong)in_stack_00000008 >> 0x20);
          Term::isSpecial((Term *)0x97de7b);
          CollectTask::CollectTask((CollectTask *)in_stack_00000010._content,CVar12);
          pSStack_568 = (Signature *)TermList::term((TermList *)0x97deaf);
          TVar7 = AtomicSort::boolSort();
          local_598 = local_570;
          pSStack_590 = pSStack_568;
          elem_17._4_4_ = in_stack_fffffffffffff5c4;
          elem_17.fncTag = in_stack_fffffffffffff5c0;
          elem_17.field_1.ts._content._0_4_ = in_stack_fffffffffffff5c8;
          elem_17.field_1.ts._content._4_4_ = in_stack_fffffffffffff5cc;
          elem_17.contextSort._content._0_4_ = in_stack_fffffffffffff5d0;
          elem_17.contextSort._content._4_4_ = in_stack_fffffffffffff5d4;
          in_stack_00000008 = local_570;
          in_stack_00000010._content = (uint64_t)pSStack_568;
          local_588 = TVar7._content;
          local_578 = TVar7._content;
          local_560 = TVar7._content;
          Lib::Stack<Kernel::SortHelper::CollectTask>::push
                    ((Stack<Kernel::SortHelper::CollectTask> *)pSStack_568,elem_17);
          break;
        }
        if ((local_9 & 1) != 0) {
          TermList::var(&local_550);
          iVar2 = Lib::MultiCounter::get
                            ((MultiCounter *)in_stack_00000010._content,
                             (int)((ulong)in_stack_00000008 >> 0x20));
          if (iVar2 != 0) break;
        }
        TermList::var(&local_550);
        local_558 = (uint64_t)AtomicSort::boolSort();
        val_02._content._4_4_ = in_stack_fffffffffffff5d4;
        val_02._content._0_4_ = in_stack_fffffffffffff5d0;
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                   in_stack_fffffffffffff5c4,val_02);
        break;
      }
      break;
    case BIND:
      Lib::List<unsigned_int>::Iterator::Iterator
                (&local_700,(List<unsigned_int> *)local_90[0].field_1.t);
      while( true ) {
        bVar1 = Lib::List<unsigned_int>::Iterator::hasNext((Iterator *)0x97e364);
        in_stack_fffffffffffff5d4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff5d4);
        if (!bVar1) break;
        in_stack_fffffffffffff5d0 =
             Lib::List<unsigned_int>::Iterator::next((Iterator *)in_stack_00000010._content);
        Lib::MultiCounter::inc
                  ((MultiCounter *)in_stack_00000010._content,
                   (int)((ulong)in_stack_00000008 >> 0x20));
      }
      break;
    case UNBIND:
      Lib::List<unsigned_int>::Iterator::Iterator
                (&local_708,(List<unsigned_int> *)local_90[0].field_1.t);
      while( true ) {
        bVar1 = Lib::List<unsigned_int>::Iterator::hasNext((Iterator *)0x97e3c4);
        in_stack_fffffffffffff5cc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff5cc);
        if (!bVar1) break;
        in_stack_fffffffffffff5c8 =
             Lib::List<unsigned_int>::Iterator::next((Iterator *)in_stack_00000010._content);
        Lib::MultiCounter::dec
                  ((MultiCounter *)in_stack_00000010._content,
                   (int)((ulong)in_stack_00000008 >> 0x20));
      }
    }
  } while( true );
}

Assistant:

void SortHelper::collectVariableSortsIter(CollectTask task, DHMap<unsigned,TermList>& map, bool ignoreBound)
{
  Stack<CollectTask> todo;
  MultiCounter bound;

  todo.push(task);
  while (todo.isNonEmpty()) {
    CollectTask task = todo.pop();

    switch(task.fncTag) {
      case COLLECT_TERM: {
        Term* term = task.t;
    
        unsigned position = 0;
        for (TermList* ts = term->args(); ts->isNonEmpty(); ts = ts->next()) {
          CollectTask newTask(COLLECT_TERMLIST);
          newTask.ts = *ts;
          newTask.contextSort = getArgSort(term, position++);
          todo.push(newTask);
        }

      } break;

      case COLLECT_TERMLIST: {
        TermList ts = task.ts;

        if (ts.isTerm()) {
          Term* term = ts.term();

          CollectTask newTask(term->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
          newTask.t = term;
          newTask.contextSort = task.contextSort;
          todo.push(newTask);
        } else if (ts.isOrdinaryVar()) {
          unsigned var = ts.var();
          if (!ignoreBound || !bound.get(var)) {
            if (!map.insert(var, task.contextSort)) {
              ASS_EQ(task.contextSort, map.get(var));
            }
          }
        }

      } break;

      case COLLECT_SPECIALTERM: {
        Term* term = task.t;

        ASS(term->isSpecial());

        Term::SpecialTermData* sd = term->getSpecialData();

        switch (term->specialFunctor()) {
          case SpecialFunctor::ITE: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = *term->nthArgument(1);
            todo.push(newTask);

            newTask.fncTag = COLLECT_FORMULA;
            newTask.f = sd->getCondition();
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET: {
            TermList binding = sd->getBinding();
            bool isPredicate = binding.isTerm() && binding.term()->isBoolean();
            Signature::Symbol* symbol = isPredicate ? env.signature->getPredicate(sd->getFunctor())
                                                    : env.signature->getFunction(sd->getFunctor());
            VList::Iterator vit(sd->getVariables());
            Substitution subst;
            auto type = isPredicate ? symbol->predType() : symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();

            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.ts = binding;
            if (!isPredicate) {
              newTask.contextSort = SubstHelper::apply(type->result(),subst);
            }
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::LET_TUPLE: {
            TermList binding = sd->getBinding();
            Signature::Symbol* symbol = env.signature->getFunction(sd->getFunctor());
            Substitution subst;
            VList::Iterator vit(sd->getTupleSymbols());
            auto type = symbol->fnType();
            for (unsigned i = 0; i < type->arity(); i++) {
              ASS(vit.hasNext());
              auto var = vit.next();
              TermList sort = AtomicSort::superSort();
              if (i < type->numTypeArguments()) {
                subst.bind(type->quantifiedVar(i).var(), TermList(var, false));
              } else {
                sort = SubstHelper::apply(type->arg(i),subst);
              }
              if (!ignoreBound || !bound.get(var)) {
                if (!map.insert(var, sort)) {
                  ASS_EQ(sort, map.get(var));
                }
              }
            }

            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getSort();
            newTask.ts = *term->nthArgument(0);
            todo.push(newTask);

            newTask.contextSort = SubstHelper::apply(type->result(),subst);
            newTask.ts = binding;
            todo.push(newTask);

            break;
          }

          case SpecialFunctor::FORMULA: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = sd->getFormula();
            todo.push(newTask);
          } break;
          case SpecialFunctor::LAMBDA: {
            CollectTask newTask(COLLECT_TERMLIST);
            newTask.contextSort = sd->getLambdaExpSort();
            newTask.ts = sd->getLambdaExp();
            todo.push(newTask);
          } break;

          case SpecialFunctor::TUPLE: {
            CollectTask newTask(COLLECT_TERM);
            newTask.t = sd->getTupleTerm();
            todo.push(newTask);
          } break;

          case SpecialFunctor::MATCH: {
            CollectTask newTask(COLLECT_TERMLIST);
            auto matchedSort = term->getSpecialData()->getMatchedSort();

            // there are two sorts here, one is the sort
            // of matched term and patterns, the other is
            // the sort of the match block and of each case
            newTask.ts = *term->nthArgument(0);
            newTask.contextSort = matchedSort;
            todo.push(newTask);
            for (unsigned int i = 1; i < term->arity(); i += 2) {
              newTask.ts = *term->nthArgument(i);
              newTask.contextSort = matchedSort;
              todo.push(newTask);

              newTask.ts = *term->nthArgument(i + 1);
              newTask.contextSort = sd->getSort();
              todo.push(newTask);
            }
            break;
          }
        }
      } break;

      case COLLECT_FORMULA: {
        Formula* f = task.f;

        switch (f->connective()) {
          case LITERAL: {
            Literal* lit = f->literal();
            if(lit->isTwoVarEquality()){
              CollectTask newTask(COLLECT_TERMLIST);
              newTask.ts = lit->twoVarEqSort();
              newTask.contextSort = AtomicSort::superSort();
              todo.push(newTask);
            }
            CollectTask newTask(COLLECT_TERM);
            newTask.t = lit;

            todo.push(newTask);
            break;
          }

          case BOOL_TERM: {
            TermList ts = f->getBooleanTerm();
            if (ts.isVar()) {
              if (!ignoreBound || !bound.get(ts.var())) {
                if (!map.insert(ts.var(), AtomicSort::boolSort())) {
                  ASS_EQ(AtomicSort::boolSort(), map.get(ts.var()));
                }
              }
            } else {
              ASS(ts.isTerm());

              CollectTask newTask(ts.term()->isSpecial() ? COLLECT_SPECIALTERM : COLLECT_TERM);
              newTask.t = ts.term();
              newTask.contextSort = AtomicSort::boolSort();

              todo.push(newTask);
            }
            break;
          }

          case EXISTS:
          case FORALL: {
            if (ignoreBound) {
              CollectTask unbindTask(UNBIND);
              unbindTask.vars = f->vars();
              todo.push(unbindTask);
            }

            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->qarg();
            todo.push(newTask);

            if (ignoreBound) {
              CollectTask bindTask(BIND);
              bindTask.vars = f->vars();
              todo.push(bindTask);
            }
            break;
          }

          case AND:
          case OR: {
            FormulaList::Iterator argIt(f->args());
            while (argIt.hasNext()) {
              CollectTask newTask(COLLECT_FORMULA);
              newTask.f = argIt.next();
              todo.push(newTask);
            }
            break;
          }

          case IMP:
          case IFF:
          case XOR: {
            CollectTask leftTask(COLLECT_FORMULA);
            leftTask.f = f->left();
            todo.push(leftTask);

            CollectTask rightTask(COLLECT_FORMULA);
            rightTask.f = f->right();
            todo.push(rightTask);
            break;
          }

          case NOT: {
            CollectTask newTask(COLLECT_FORMULA);
            newTask.f = f->uarg();
            todo.push(newTask);
            break;
          }

          default:
            continue;
        }
      } break;

      case BIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.inc(vit.next());
        }
      } break;

      case UNBIND: {
        VList::Iterator vit(task.vars);
        while (vit.hasNext()) {
          bound.dec(vit.next());
        }
      } break;
    }
  }
}